

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O1

any __thiscall
Scine::Core::ModuleManager::Impl::get(Impl *this,string *interface,string *model,string *moduleName)

{
  pointer pcVar1;
  undefined8 *puVar2;
  size_t sVar3;
  char cVar4;
  int iVar5;
  pointer pcVar6;
  undefined8 *puVar7;
  vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  *__range3;
  long *in_R8;
  shared_ptr<Scine::Core::Module> *modulePtr;
  LibraryAndModules *source;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  string modulePtrLower;
  string moduleNameLower;
  long *local_d0;
  size_t local_c8;
  long local_c0 [2];
  locale local_b0 [8];
  long *local_a8;
  size_t local_a0;
  long local_98 [2];
  long *local_88;
  size_t local_80;
  long local_78 [2];
  long *local_68;
  long local_60;
  long local_58 [2];
  pointer local_48;
  pointer local_40;
  undefined8 *local_38;
  
  std::locale::locale((locale *)&local_d0);
  local_a8 = local_98;
  std::__cxx11::string::
  _M_construct<boost::iterators::transform_iterator<boost::algorithm::detail::to_lowerF<char>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::use_default,boost::use_default>>
            ((string *)&local_a8,*in_R8,(locale *)&local_d0,in_R8[1] + *in_R8,(locale *)&local_d0);
  std::locale::~locale((locale *)&local_d0);
  if (in_R8[1] != 0) {
    iVar5 = std::__cxx11::string::compare((char *)&local_a8);
    if (iVar5 != 0) {
      pcVar6 = (interface->_M_dataplus)._M_p;
      local_48 = (pointer)interface->_M_string_length;
      if (pcVar6 != local_48) {
        do {
          puVar7 = *(undefined8 **)(pcVar6 + 8);
          local_38 = *(undefined8 **)(pcVar6 + 0x10);
          local_40 = pcVar6;
          if (puVar7 != local_38) {
            do {
              (**(code **)(*(long *)*puVar7 + 0x10))(&local_68);
              std::locale::locale(local_b0);
              local_d0 = local_c0;
              std::__cxx11::string::
              _M_construct<boost::iterators::transform_iterator<boost::algorithm::detail::to_lowerF<char>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::use_default,boost::use_default>>
                        ((string *)&local_d0,local_68,local_b0,local_60 + (long)local_68,local_b0);
              std::locale::~locale(local_b0);
              if (local_68 != local_58) {
                operator_delete(local_68,local_58[0] + 1);
              }
              sVar3 = local_a0;
              bVar9 = true;
              if (local_c8 == local_a0) {
                if (local_c8 == 0) {
                  bVar9 = false;
                }
                else {
                  iVar5 = bcmp(local_d0,local_a8,local_c8);
                  bVar9 = iVar5 != 0;
                }
              }
              if (bVar9) {
                local_88 = local_78;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_88,local_a8,sVar3 + (long)local_a8);
                std::__cxx11::string::append((char *)&local_88);
                bVar10 = true;
                if (local_c8 == local_80) {
                  if (local_c8 == 0) goto LAB_00109a67;
                  iVar5 = bcmp(local_d0,local_88,local_c8);
                  bVar10 = iVar5 != 0;
                }
              }
              else {
LAB_00109a67:
                bVar10 = false;
              }
              if ((bVar9) && (local_88 != local_78)) {
                operator_delete(local_88,local_78[0] + 1);
              }
              uVar8 = 5;
              if (!bVar10) {
                cVar4 = (**(code **)(*(long *)*puVar7 + 0x20))((long *)*puVar7,model,moduleName);
                uVar8 = 0;
                if (cVar4 != '\0') {
                  uVar8 = 1;
                  (**(code **)(*(long *)*puVar7 + 0x18))(this,(long *)*puVar7,model,moduleName);
                }
              }
              if (local_d0 != local_c0) {
                operator_delete(local_d0,local_c0[0] + 1);
              }
              if ((uVar8 != 5) && (uVar8 != 0)) goto LAB_00109b0b;
              puVar7 = puVar7 + 2;
            } while (puVar7 != local_38);
            uVar8 = 0;
LAB_00109b0b:
            if ((uVar8 & 3) != 0) {
LAB_00109bb8:
              if (local_a8 != local_98) {
                operator_delete(local_a8,local_98[0] + 1);
              }
              return (any)(placeholder *)this;
            }
          }
          pcVar6 = local_40 + 0x20;
        } while (pcVar6 != local_48);
      }
      goto LAB_00109b2f;
    }
  }
  pcVar1 = (pointer)interface->_M_string_length;
  for (pcVar6 = (interface->_M_dataplus)._M_p; pcVar6 != pcVar1; pcVar6 = pcVar6 + 0x20) {
    puVar2 = *(undefined8 **)(pcVar6 + 0x10);
    for (puVar7 = *(undefined8 **)(pcVar6 + 8); puVar7 != puVar2; puVar7 = puVar7 + 2) {
      cVar4 = (**(code **)(*(long *)*puVar7 + 0x20))((long *)*puVar7,model,moduleName);
      if (cVar4 != '\0') {
        (**(code **)(*(long *)*puVar7 + 0x18))(this,(long *)*puVar7,model,moduleName);
        if (cVar4 != '\0') goto LAB_00109bb8;
      }
    }
  }
LAB_00109b2f:
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = &PTR__exception_00112d30;
  __cxa_throw(puVar7,&ClassNotImplementedError::typeinfo,std::exception::~exception);
}

Assistant:

boost::any get(const std::string& interface, const std::string& model, const std::string& moduleName) const {
    std::string moduleNameLower = boost::algorithm::to_lower_copy(moduleName);
    if (!moduleName.empty() && moduleNameLower != "any") {
      for (const auto& source : _sources) {
        for (const auto& modulePtr : source.modules) {
          std::string modulePtrLower = boost::algorithm::to_lower_copy(modulePtr->name());
          if ((modulePtrLower != moduleNameLower) && (modulePtrLower != moduleNameLower + "module")) {
            continue;
          }

          if (modulePtr->has(interface, model)) {
            return modulePtr->get(interface, model);
          }
        }
      }
    }
    else {
      for (const auto& source : _sources) {
        for (const auto& modulePtr : source.modules) {
          if (modulePtr->has(interface, model)) {
            return modulePtr->get(interface, model);
          }
        }
      }
    }

    throw ClassNotImplementedError{};
  }